

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

char * GGUFMeta::GKV<int>::override_type_to_str(llama_model_kv_override_type ty)

{
  llama_model_kv_override_type ty_local;
  char *local_8;
  
  switch(ty) {
  case LLAMA_KV_OVERRIDE_TYPE_INT:
    local_8 = "int";
    break;
  case LLAMA_KV_OVERRIDE_TYPE_FLOAT:
    local_8 = "float";
    break;
  case LLAMA_KV_OVERRIDE_TYPE_BOOL:
    local_8 = "bool";
    break;
  case LLAMA_KV_OVERRIDE_TYPE_STR:
    local_8 = "str";
    break;
  default:
    local_8 = "unknown";
  }
  return local_8;
}

Assistant:

static const char * override_type_to_str(const llama_model_kv_override_type ty) {
            switch (ty) {
                case LLAMA_KV_OVERRIDE_TYPE_BOOL:  return "bool";
                case LLAMA_KV_OVERRIDE_TYPE_INT:   return "int";
                case LLAMA_KV_OVERRIDE_TYPE_FLOAT: return "float";
                case LLAMA_KV_OVERRIDE_TYPE_STR:   return "str";
            }
            return "unknown";
        }